

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       list_caster<std::vector<LongReadMapping,std::allocator<LongReadMapping>>,LongReadMapping>::
       cast<std::vector<LongReadMapping,std::allocator<LongReadMapping>>const&>
                 (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *src,
                 return_value_policy policy,handle parent)

{
  pointer pLVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  pointer src_00;
  list l;
  object value_;
  handle local_40;
  handle local_38;
  
  list::list((list *)&local_40,
             (long)(src->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(src->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  src_00 = (src->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar1 = (src->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = 0;
  do {
    hVar2.m_ptr = local_40.m_ptr;
    if (src_00 == pLVar1) {
      local_40.m_ptr = (PyObject *)0x0;
      goto LAB_001eda64;
    }
    hVar2 = type_caster_base<LongReadMapping>::cast(src_00,policy,parent);
    local_38 = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      local_38.m_ptr = (PyObject *)0x0;
      (&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt)[lVar3] = (Py_ssize_t)hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    object::~object((object *)&local_38);
    src_00 = src_00 + 0x20;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_001eda64:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }